

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

JSONNode __thiscall JSONNode::duplicate(JSONNode *this)

{
  size_t *psVar1;
  internalJSONNode *piVar2;
  long *in_RSI;
  
  piVar2 = (internalJSONNode *)*in_RSI;
  psVar1 = &piVar2->refcount;
  *psVar1 = *psVar1 + 1;
  this->internal = piVar2;
  makeUniqueInternal(this);
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::duplicate(void) const json_nothrow {
    JSON_CHECK_INTERNAL();
    JSONNode mycopy(*this);
    #ifdef JSON_REF_COUNT
	   JSON_ASSERT(internal == mycopy.internal, JSON_TEXT("copy ctor failed to ref count correctly"));
	   mycopy.makeUniqueInternal();
    #endif
    JSON_ASSERT(internal != mycopy.internal, JSON_TEXT("makeUniqueInternal failed"));
    return mycopy;
}